

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O2

void __thiscall fasttext::DenseMatrix::load(DenseMatrix *this,istream *in)

{
  allocator_type local_31;
  _Vector_base<float,_std::allocator<float>_> local_30;
  
  std::istream::read((char *)in,(long)&(this->super_Matrix).m_);
  std::istream::read((char *)in,(long)&(this->super_Matrix).n_);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_30,
             (this->super_Matrix).n_ * (this->super_Matrix).m_,&local_31);
  std::vector<float,_std::allocator<float>_>::_M_move_assign(&this->data_,&local_30);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_30);
  std::istream::read((char *)in,
                     (long)(this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start);
  return;
}

Assistant:

void DenseMatrix::load(std::istream& in) {
  in.read((char*)&m_, sizeof(int64_t));
  in.read((char*)&n_, sizeof(int64_t));
  data_ = std::vector<real>(m_ * n_);
  in.read((char*)data_.data(), m_ * n_ * sizeof(real));
}